

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O0

ssize_t __thiscall
fanuc_post_processor::generate_LS::write(generate_LS *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  ostream *this_00;
  ssize_t sVar2;
  ostream local_210 [8];
  ofstream output_file;
  generate_LS *this_local;
  
  std::ofstream::ofstream(local_210);
  std::ofstream::open(local_210,"/home/sizen/CLionProjects/generate_LS/pos.ls",0x10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"cannot open file !!!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<(local_210,(string *)this);
  std::ofstream::close();
  sVar2 = std::ofstream::~ofstream(local_210);
  return sVar2;
}

Assistant:

void generate_LS::write() {
        std::ofstream output_file;
        output_file.open("/home/sizen/CLionProjects/generate_LS/pos.ls");
        if(output_file.fail()) std::cout<<"cannot open file !!!"<<std::endl;
        output_file<<program;
        output_file.close();

    }